

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::XFileImporter::InternReadFile
          (XFileImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  vector<char,_std::allocator<char>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  ulong uVar3;
  DeadlyImportError *pDVar4;
  allocator local_89;
  XFileParser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long *plVar2;
  
  std::__cxx11::string::string((string *)&parser,"rb",(allocator *)&local_50);
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,parser._0_8_);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::~string((string *)&parser);
  if (plVar2 == (long *)0x0) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Failed to open file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                   &local_50,".");
    DeadlyImportError::DeadlyImportError(pDVar4,(string *)&parser);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = (**(code **)(*plVar2 + 0x30))(plVar2);
  if (0xf < uVar3) {
    this_00 = &this->mBuffer;
    std::vector<char,_std::allocator<char>_>::resize(this_00,uVar3 + 1);
    (**(code **)(*plVar2 + 0x10))
              (plVar2,(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start,1,uVar3);
    BaseImporter::ConvertToUTF8(this_00);
    XFileParser::XFileParser(&parser,this_00);
    CreateDataRepresentationFromImport(this,pScene,parser.mScene);
    if (pScene->mRootNode != (aiNode *)0x0) {
      XFileParser::~XFileParser(&parser);
      (**(code **)(*plVar2 + 8))(plVar2);
      return;
    }
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_50,"XFile is ill-formatted - no content imported.",&local_89);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_50);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&parser,"XFile is too small.",(allocator *)&local_50);
  DeadlyImportError::DeadlyImportError(pDVar4,(string *)&parser);
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void XFileImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    // read file into memory
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));
    if ( file.get() == NULL ) {
        throw DeadlyImportError( "Failed to open file " + pFile + "." );
    }

    static const size_t MinSize = 16;
    size_t fileSize = file->FileSize();
    if ( fileSize < MinSize ) {
        throw DeadlyImportError( "XFile is too small." );
    }

    // in the hope that binary files will never start with a BOM ...
    mBuffer.resize( fileSize + 1);
    file->Read( &mBuffer.front(), 1, fileSize);
    ConvertToUTF8(mBuffer);

    // parse the file into a temporary representation
    XFileParser parser( mBuffer);

    // and create the proper return structures out of it
    CreateDataRepresentationFromImport( pScene, parser.GetImportedData());

    // if nothing came from it, report it as error
    if ( !pScene->mRootNode ) {
        throw DeadlyImportError( "XFile is ill-formatted - no content imported." );
    }
}